

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

int xmlDocContentDumpOutput(xmlSaveCtxtPtr ctxt,xmlDocPtr cur)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlOutputBufferPtr buf;
  xmlCharEncodingOutputFunc p_Var4;
  xmlCharEncodingOutputFunc p_Var5;
  byte bVar6;
  xmlCharEncoding xVar7;
  uint uVar8;
  int iVar9;
  xmlChar *encoding;
  xmlDtdPtr pxVar10;
  char *buf_00;
  xmlNodePtr child;
  _xmlNode *cur_00;
  uint uVar11;
  xmlChar *encoding_00;
  
  pxVar2 = cur->encoding;
  pxVar3 = ctxt->encoding;
  buf = ctxt->buf;
  p_Var4 = ctxt->escape;
  p_Var5 = ctxt->escapeAttr;
  xmlInitParser();
  xVar1 = cur->type;
  if ((xVar1 | XML_CDATA_SECTION_NODE) != XML_HTML_DOCUMENT_NODE) {
    return -1;
  }
  if (ctxt->encoding == (xmlChar *)0x0) {
    encoding = cur->encoding;
    if (cur->encoding == (xmlChar *)0x0) {
      encoding = pxVar3;
    }
  }
  else {
    cur->encoding = ctxt->encoding;
    encoding = pxVar3;
  }
  uVar8 = ctxt->options;
  if (((uVar8 & 0x30) == 0 && xVar1 == XML_HTML_DOCUMENT_NODE) || ((uVar8 & 0x40) != 0)) {
    if (encoding == (xmlChar *)0x0) {
      encoding = htmlGetMetaEncoding(cur);
    }
    else {
      htmlSetMetaEncoding(cur,encoding);
    }
    encoding_00 = (xmlChar *)"HTML";
    if (encoding != (xmlChar *)0x0) {
      encoding_00 = encoding;
    }
    if ((((pxVar3 != (xmlChar *)0x0) || (buf->encoder != (xmlCharEncodingHandlerPtr)0x0)) ||
        (buf->conv != (xmlBufPtr)0x0)) ||
       (iVar9 = xmlSaveSwitchEncoding(ctxt,(char *)encoding_00), -1 < iVar9)) {
      htmlDocContentDumpFormatOutput(buf,cur,(char *)encoding_00,ctxt->options & 1);
      iVar9 = 0;
      if (ctxt->encoding == (xmlChar *)0x0) {
        return 0;
      }
      goto LAB_001a0eac;
    }
LAB_001a100d:
    iVar9 = -1;
    goto LAB_001a0eac;
  }
  iVar9 = 0;
  if (xVar1 != XML_DOCUMENT_NODE && (uVar8 & 0x30) == 0) goto LAB_001a0eac;
  xVar7 = xmlParseCharEncoding((char *)encoding);
  bVar6 = 0;
  if (((pxVar3 == (xmlChar *)0x0 && encoding != (xmlChar *)0x0) &&
      (buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) &&
     ((buf->conv == (xmlBufPtr)0x0 && (bVar6 = 0, (ctxt->options & 2) == 0)))) {
    if ((0x16 < (uint)xVar7) ||
       (bVar6 = 0,
       (0x400003U >> (xVar7 & (XML_CHAR_ENCODING_8859_7|XML_CHAR_ENCODING_8859_6)) & 1) == 0)) {
      iVar9 = xmlSaveSwitchEncoding(ctxt,(char *)encoding);
      if (iVar9 < 0) goto LAB_001a100d;
      bVar6 = 1;
    }
    if (ctxt->escape == xmlEscapeEntities) {
      ctxt->escape = (xmlCharEncodingOutputFunc)0x0;
    }
    if (ctxt->escapeAttr == xmlEscapeEntities) {
      ctxt->escapeAttr = (xmlCharEncodingOutputFunc)0x0;
    }
  }
  uVar8 = ctxt->options;
  if ((uVar8 & 2) == 0) {
    xmlOutputBufferWrite(buf,0xe,"<?xml version=");
    if (cur->version == (xmlChar *)0x0) {
      xmlOutputBufferWrite(buf,5,"\"1.0\"");
    }
    else {
      xmlBufWriteQuotedString(buf->buffer,cur->version);
    }
    if (encoding != (xmlChar *)0x0) {
      xmlOutputBufferWrite(buf,10," encoding=");
      xmlBufWriteQuotedString(buf->buffer,encoding);
    }
    if (cur->standalone == 1) {
      buf_00 = " standalone=\"yes\"";
      iVar9 = 0x11;
LAB_001a0f1b:
      xmlOutputBufferWrite(buf,iVar9,buf_00);
    }
    else if (cur->standalone == 0) {
      buf_00 = " standalone=\"no\"";
      iVar9 = 0x10;
      goto LAB_001a0f1b;
    }
    xmlOutputBufferWrite(buf,3,"?>\n");
    uVar8 = ctxt->options;
  }
  uVar11 = uVar8 >> 4 & 1;
  if (((uVar8 & 8) == 0) && (pxVar10 = xmlGetIntSubset(cur), pxVar10 != (xmlDtdPtr)0x0)) {
    uVar8 = xmlIsXHTML(pxVar10->SystemID,pxVar10->ExternalID);
    uVar11 = 0;
    if (0 < (int)uVar8) {
      uVar11 = uVar8;
    }
  }
  cur_00 = cur->children;
  if (cur_00 != (_xmlNode *)0x0) {
    for (; cur_00 != (xmlNodePtr)0x0; cur_00 = cur_00->next) {
      ctxt->level = 0;
      if (uVar11 == 0) {
        xmlNodeDumpOutputInternal(ctxt,cur_00);
      }
      else {
        xhtmlNodeDumpOutput(ctxt,cur_00);
      }
      if (1 < cur_00->type - XML_XINCLUDE_START) {
        xmlOutputBufferWrite(buf,1,"\n");
      }
    }
  }
  iVar9 = 0;
  if ((bool)(bVar6 & pxVar3 == (xmlChar *)0x0)) {
    xmlSaveClearEncoding(ctxt);
    ctxt->escape = p_Var4;
    ctxt->escapeAttr = p_Var5;
  }
LAB_001a0eac:
  cur->encoding = pxVar2;
  return iVar9;
}

Assistant:

static int
xmlDocContentDumpOutput(xmlSaveCtxtPtr ctxt, xmlDocPtr cur) {
#ifdef LIBXML_HTML_ENABLED
    xmlDtdPtr dtd;
    int is_xhtml = 0;
#endif
    const xmlChar *oldenc = cur->encoding;
    const xmlChar *oldctxtenc = ctxt->encoding;
    const xmlChar *encoding = ctxt->encoding;
    xmlCharEncodingOutputFunc oldescape = ctxt->escape;
    xmlCharEncodingOutputFunc oldescapeAttr = ctxt->escapeAttr;
    xmlOutputBufferPtr buf = ctxt->buf;
    xmlCharEncoding enc;
    int switched_encoding = 0;

    xmlInitParser();

    if ((cur->type != XML_HTML_DOCUMENT_NODE) &&
        (cur->type != XML_DOCUMENT_NODE))
	 return(-1);

    if (ctxt->encoding != NULL) {
        cur->encoding = BAD_CAST ctxt->encoding;
    } else if (cur->encoding != NULL) {
	encoding = cur->encoding;
    }

    if (((cur->type == XML_HTML_DOCUMENT_NODE) &&
         ((ctxt->options & XML_SAVE_AS_XML) == 0) &&
         ((ctxt->options & XML_SAVE_XHTML) == 0)) ||
        (ctxt->options & XML_SAVE_AS_HTML)) {
#ifdef LIBXML_HTML_ENABLED
        if (encoding != NULL)
	    htmlSetMetaEncoding(cur, (const xmlChar *) encoding);
        if (encoding == NULL)
	    encoding = htmlGetMetaEncoding(cur);
        if (encoding == NULL)
	    encoding = BAD_CAST "HTML";
	if ((encoding != NULL) && (oldctxtenc == NULL) &&
	    (buf->encoder == NULL) && (buf->conv == NULL)) {
	    if (xmlSaveSwitchEncoding(ctxt, (const char*) encoding) < 0) {
		cur->encoding = oldenc;
		return(-1);
	    }
	}
        if (ctxt->options & XML_SAVE_FORMAT)
	    htmlDocContentDumpFormatOutput(buf, cur,
	                                   (const char *)encoding, 1);
	else
	    htmlDocContentDumpFormatOutput(buf, cur,
	                                   (const char *)encoding, 0);
	if (ctxt->encoding != NULL)
	    cur->encoding = oldenc;
	return(0);
#else
        return(-1);
#endif
    } else if ((cur->type == XML_DOCUMENT_NODE) ||
               (ctxt->options & XML_SAVE_AS_XML) ||
               (ctxt->options & XML_SAVE_XHTML)) {
	enc = xmlParseCharEncoding((const char*) encoding);
	if ((encoding != NULL) && (oldctxtenc == NULL) &&
	    (buf->encoder == NULL) && (buf->conv == NULL) &&
	    ((ctxt->options & XML_SAVE_NO_DECL) == 0)) {
	    if ((enc != XML_CHAR_ENCODING_UTF8) &&
		(enc != XML_CHAR_ENCODING_NONE) &&
		(enc != XML_CHAR_ENCODING_ASCII)) {
		/*
		 * we need to switch to this encoding but just for this
		 * document since we output the XMLDecl the conversion
		 * must be done to not generate not well formed documents.
		 */
		if (xmlSaveSwitchEncoding(ctxt, (const char*) encoding) < 0) {
		    cur->encoding = oldenc;
		    return(-1);
		}
		switched_encoding = 1;
	    }
	    if (ctxt->escape == xmlEscapeEntities)
		ctxt->escape = NULL;
	    if (ctxt->escapeAttr == xmlEscapeEntities)
		ctxt->escapeAttr = NULL;
	}


	/*
	 * Save the XML declaration
	 */
	if ((ctxt->options & XML_SAVE_NO_DECL) == 0) {
	    xmlOutputBufferWrite(buf, 14, "<?xml version=");
	    if (cur->version != NULL)
		xmlBufWriteQuotedString(buf->buffer, cur->version);
	    else
		xmlOutputBufferWrite(buf, 5, "\"1.0\"");
	    if (encoding != NULL) {
		xmlOutputBufferWrite(buf, 10, " encoding=");
		xmlBufWriteQuotedString(buf->buffer, (xmlChar *) encoding);
	    }
	    switch (cur->standalone) {
		case 0:
		    xmlOutputBufferWrite(buf, 16, " standalone=\"no\"");
		    break;
		case 1:
		    xmlOutputBufferWrite(buf, 17, " standalone=\"yes\"");
		    break;
	    }
	    xmlOutputBufferWrite(buf, 3, "?>\n");
	}

#ifdef LIBXML_HTML_ENABLED
        if (ctxt->options & XML_SAVE_XHTML)
            is_xhtml = 1;
	if ((ctxt->options & XML_SAVE_NO_XHTML) == 0) {
	    dtd = xmlGetIntSubset(cur);
	    if (dtd != NULL) {
		is_xhtml = xmlIsXHTML(dtd->SystemID, dtd->ExternalID);
		if (is_xhtml < 0) is_xhtml = 0;
	    }
	}
#endif
	if (cur->children != NULL) {
	    xmlNodePtr child = cur->children;

	    while (child != NULL) {
		ctxt->level = 0;
#ifdef LIBXML_HTML_ENABLED
		if (is_xhtml)
		    xhtmlNodeDumpOutput(ctxt, child);
		else
#endif
		    xmlNodeDumpOutputInternal(ctxt, child);
                if ((child->type != XML_XINCLUDE_START) &&
                    (child->type != XML_XINCLUDE_END))
                    xmlOutputBufferWrite(buf, 1, "\n");
		child = child->next;
	    }
	}
    }

    /*
     * Restore the state of the saving context at the end of the document
     */
    if ((switched_encoding) && (oldctxtenc == NULL)) {
	xmlSaveClearEncoding(ctxt);
	ctxt->escape = oldescape;
	ctxt->escapeAttr = oldescapeAttr;
    }
    cur->encoding = oldenc;
    return(0);
}